

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.h
# Opt level: O3

void __thiscall jbcoin::STAccount::add(STAccount *this,Serializer *s)

{
  SField *pSVar1;
  int len;
  
  pSVar1 = (this->super_STBase).fName;
  if (0xff < pSVar1->fieldValue) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STAccount.h"
                  ,0x47,"virtual void jbcoin::STAccount::add(Serializer &) const");
  }
  if (pSVar1->fieldType == STI_ACCOUNT) {
    len = 0x14;
    if (this->default_ != false) {
      len = 0;
    }
    Serializer::addVL(s,&this->value_,len);
    return;
  }
  __assert_fail("fName->fieldType == STI_ACCOUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STAccount.h"
                ,0x48,"virtual void jbcoin::STAccount::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == STI_ACCOUNT);

        // Preserve the serialization behavior of an STBlob:
        //  o If we are default (all zeros) serialize as an empty blob.
        //  o Otherwise serialize 160 bits.
        int const size = isDefault() ? 0 : uint160::bytes;
        s.addVL (value_.data(), size);
    }